

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O3

void gl_RecalcVertexHeights(vertex_t *v)

{
  sector_t *psVar1;
  float *pfVar2;
  secplane_t *psVar3;
  bool bVar4;
  secplane_t *psVar5;
  secplane_t *psVar6;
  secplane_t *psVar7;
  bool bVar8;
  uint uVar9;
  size_t __n;
  long lVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  
  v->numheights = 0;
  if (0 < v->numsectors) {
    uVar9 = 0;
    lVar11 = 0;
    do {
      bVar8 = true;
      do {
        bVar4 = bVar8;
        psVar1 = v->sectors[lVar11];
        psVar3 = &psVar1->ceilingplane;
        psVar5 = &psVar1->ceilingplane;
        if (!bVar4) {
          psVar3 = &psVar1->floorplane;
          psVar5 = &psVar1->floorplane;
        }
        psVar6 = &psVar1->ceilingplane;
        if (!bVar4) {
          psVar6 = &psVar1->floorplane;
        }
        psVar7 = &psVar1->ceilingplane;
        if (!bVar4) {
          psVar7 = &psVar1->floorplane;
        }
        fVar13 = (float)(((v->p).Y * (psVar6->normal).Y + (v->p).X * (psVar3->normal).X + psVar5->D)
                        * psVar7->negiC);
        if ((int)uVar9 < 1) {
          uVar12 = 0;
LAB_00370ee8:
          if ((uint)uVar12 == uVar9) goto LAB_00370eed;
        }
        else {
          pfVar2 = v->heightlist;
          __n = (long)(int)uVar9 << 2;
          uVar12 = 0;
          do {
            if (fVar13 == pfVar2[uVar12]) goto LAB_00370ee8;
            if (fVar13 < pfVar2[uVar12]) {
              memmove(pfVar2 + uVar12 + 1,pfVar2 + uVar12,__n);
              v->heightlist[uVar12] = fVar13;
              uVar9 = v->numheights + 1;
              v->numheights = uVar9;
              goto LAB_00370ee8;
            }
            uVar12 = uVar12 + 1;
            __n = __n - 4;
          } while (uVar9 != uVar12);
LAB_00370eed:
          lVar10 = (long)(int)uVar9;
          uVar9 = uVar9 + 1;
          v->numheights = uVar9;
          v->heightlist[lVar10] = fVar13;
        }
        bVar8 = false;
      } while (bVar4);
      lVar11 = lVar11 + 1;
    } while (lVar11 < v->numsectors);
    if (2 < (int)uVar9) goto LAB_00370f29;
  }
  v->numheights = 0;
LAB_00370f29:
  v->dirty = false;
  return;
}

Assistant:

void gl_RecalcVertexHeights(vertex_t * v)
{
	int i,j,k;
	float height;

	v->numheights=0;
	for(i=0;i<v->numsectors;i++)
	{
		for(j=0;j<2;j++)
		{
			if (j==0) height=v->sectors[i]->ceilingplane.ZatPoint(v);
			else height=v->sectors[i]->floorplane.ZatPoint(v);

			for(k=0;k<v->numheights;k++)
			{
				if (height == v->heightlist[k]) break;
				if (height < v->heightlist[k])
				{
					memmove(&v->heightlist[k+1], &v->heightlist[k], sizeof(float) * (v->numheights-k));
					v->heightlist[k]=height;
					v->numheights++;
					break;
				}
			}
			if (k==v->numheights) v->heightlist[v->numheights++]=height;
		}
	}
	if (v->numheights<=2) v->numheights=0;	// is not in need of any special attention
	v->dirty = false;
}